

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O3

void __thiscall
kratos::DebugDatabase::save_database(DebugDatabase *this,string *filename,bool override)

{
  __node_base_ptr *__return_storage_ptr__;
  Generator *pGVar1;
  Module *pMVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  undefined8 *puVar5;
  __node_base_ptr p_Var6;
  pointer puVar7;
  bool bVar8;
  _Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  iterator iVar9;
  _Rb_tree_node_base *p_Var10;
  __hash_code __code;
  long *plVar11;
  undefined7 in_register_00000011;
  Generator *pGVar12;
  Generator *extraout_RDX;
  Generator *extraout_RDX_00;
  ulong uVar13;
  long *plVar14;
  long *plVar15;
  __node_base_ptr p_Var16;
  unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_> *m;
  undefined8 *puVar17;
  pointer puVar18;
  undefined1 local_428 [8];
  unordered_map<const_kratos::Stmt_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  breakpoint_conditions;
  ofstream stream;
  undefined4 uStack_3e4;
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_3e0;
  long local_3a8;
  Generator *local_3a0;
  _Hashtable<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_398;
  DebugDatabase *local_360;
  undefined1 *local_358;
  ios_base local_2f8 [264];
  undefined1 local_1f0 [8];
  SymbolTable table;
  long local_158 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Hash_node_base *local_128;
  _Hash_node_base *p_Stack_120;
  _Hash_node_base *local_118;
  undefined1 local_110 [8];
  unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
  visited_gens;
  __node_base local_c8;
  pointer psStack_c0;
  undefined1 local_b8 [8];
  unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
  gen_mod_map;
  undefined1 local_58 [8];
  Generator *gen_1;
  undefined8 local_48;
  undefined8 local_38;
  
  pGVar12 = (Generator *)CONCAT71(in_register_00000011,override);
  local_38 = this;
  if (((int)pGVar12 != 0) && (bVar8 = fs::exists(filename), pGVar12 = extraout_RDX, bVar8)) {
    fs::remove((char *)filename);
    pGVar12 = extraout_RDX_00;
  }
  compute_enable_condition_abi_cxx11_
            ((unordered_map<const_kratos::Stmt_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_428,*(kratos **)(local_38 + 0xe8),pGVar12);
  visited_gens._M_h._M_single_bucket = &local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&visited_gens._M_h._M_single_bucket,"kratos","");
  local_1f0 = (undefined1  [8])&table.framework_name_._M_string_length;
  if (visited_gens._M_h._M_single_bucket == &local_c8) {
    table.framework_name_.field_2._M_allocated_capacity = (size_type)psStack_c0;
  }
  else {
    local_1f0 = (undefined1  [8])visited_gens._M_h._M_single_bucket;
  }
  table.framework_name_._M_string_length = CONCAT71(local_c8._M_nxt._1_7_,local_c8._M_nxt._0_1_);
  table.top_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&table.top_names_;
  local_c8._M_nxt._0_1_ = GeneratorKind;
  table.top_names_._M_t._M_impl._0_4_ = 0;
  table.top_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table.top_names_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  table.top_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  table.top_names_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  table.modules_.
  super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  table.modules_.
  super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  table.modules_.
  super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  table.variables_.super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  table.variables_.super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  table.variables_.super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
  local_b8 = (undefined1  [8])&gen_mod_map._M_h._M_rehash_policy._M_next_resize;
  gen_mod_map._M_h._M_buckets = (__buckets_ptr)0x1;
  gen_mod_map._M_h._M_bucket_count = 0;
  gen_mod_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  gen_mod_map._M_h._M_element_count._0_4_ = 0x3f800000;
  gen_mod_map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  gen_mod_map._M_h._M_rehash_policy._4_4_ = 0;
  gen_mod_map._M_h._M_rehash_policy._M_next_resize = 0;
  plVar11 = *(long **)(local_38 + 0xc0);
  table.top_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       table.top_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  visited_gens._M_h._M_single_bucket = &local_c8;
  if (plVar11 != (long *)0x0) {
    do {
      breakpoint_conditions._M_h._M_single_bucket = (__node_base_ptr)plVar11[1];
      local_110 = (undefined1  [8])
                  hgdb::json::SymbolTable::add_module
                            ((SymbolTable *)local_1f0,
                             (string *)(breakpoint_conditions._M_h._M_single_bucket + 0xf));
      std::
      _Hashtable<kratos::Generator*,std::pair<kratos::Generator*const,hgdb::json::Module*>,std::allocator<std::pair<kratos::Generator*const,hgdb::json::Module*>>,std::__detail::_Select1st,std::equal_to<kratos::Generator*>,std::hash<kratos::Generator*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<kratos::Generator*&,hgdb::json::Module*&>
                ((_Hashtable<kratos::Generator*,std::pair<kratos::Generator*const,hgdb::json::Module*>,std::allocator<std::pair<kratos::Generator*const,hgdb::json::Module*>>,std::__detail::_Select1st,std::equal_to<kratos::Generator*>,std::hash<kratos::Generator*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_b8,&breakpoint_conditions._M_h._M_single_bucket,local_110);
      plVar11 = (long *)*plVar11;
    } while (plVar11 != (long *)0x0);
    plVar11 = *(long **)(local_38 + 0xc0);
    if (plVar11 != (long *)0x0) {
      __return_storage_ptr__ = &breakpoint_conditions._M_h._M_single_bucket;
      do {
        pGVar12 = (Generator *)plVar11[1];
        if (*(long **)((long)local_b8 + ((ulong)pGVar12 % (ulong)gen_mod_map._M_h._M_buckets) * 8)
            == (long *)0x0) {
LAB_001f10c9:
          std::__throw_out_of_range("_Map_base::at");
        }
        plVar14 = (long *)**(long **)((long)local_b8 +
                                     ((ulong)pGVar12 % (ulong)gen_mod_map._M_h._M_buckets) * 8);
        pGVar1 = (Generator *)plVar14[1];
        while (pGVar12 != pGVar1) {
          plVar14 = (long *)*plVar14;
          if ((plVar14 == (long *)0x0) ||
             (pGVar1 = (Generator *)plVar14[1],
             (ulong)pGVar1 % (ulong)gen_mod_map._M_h._M_buckets !=
             (ulong)pGVar12 % (ulong)gen_mod_map._M_h._M_buckets)) goto LAB_001f10c9;
        }
        pMVar2 = (Module *)plVar14[2];
        Generator::get_child_generators
                  ((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                    *)__return_storage_ptr__,pGVar12);
        p_Var6 = (__node_base_ptr)CONCAT44(uStack_3e4,_stream);
        for (p_Var16 = breakpoint_conditions._M_h._M_single_bucket; p_Var16 != p_Var6;
            p_Var16 = p_Var16 + 2) {
          p_Var3 = p_Var16->_M_nxt;
          uVar13 = (ulong)p_Var3 % (ulong)gen_mod_map._M_h._M_buckets;
          if (*(long **)((long)local_b8 + uVar13 * 8) != (long *)0x0) {
            plVar14 = (long *)**(long **)((long)local_b8 + uVar13 * 8);
            p_Var4 = (_Hash_node_base *)plVar14[1];
            plVar15 = plVar14;
            if (p_Var3 != p_Var4) {
              do {
                plVar15 = (long *)*plVar15;
                if ((plVar15 == (long *)0x0) ||
                   ((ulong)plVar15[1] % (ulong)gen_mod_map._M_h._M_buckets != uVar13))
                goto LAB_001f0a97;
              } while (p_Var3 != (_Hash_node_base *)plVar15[1]);
              while (p_Var3 != p_Var4) {
                plVar14 = (long *)*plVar14;
                if ((plVar14 == (long *)0x0) ||
                   (p_Var4 = (_Hash_node_base *)plVar14[1],
                   (ulong)p_Var4 % (ulong)gen_mod_map._M_h._M_buckets != uVar13)) {
                  std::__throw_out_of_range("_Map_base::at");
                }
              }
            }
            hgdb::json::Module::add_instance(pMVar2,(string *)(p_Var3 + 0x13),(Module *)plVar14[2]);
          }
LAB_001f0a97:
        }
        std::
        vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
        ::~vector((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                   *)__return_storage_ptr__);
        plVar11 = (long *)*plVar11;
      } while (plVar11 != (long *)0x0);
      plVar11 = *(long **)(local_38 + 0xc0);
      if (plVar11 != (long *)0x0) {
        this_00 = (_Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(local_38 + 0x48);
        do {
          local_58 = (undefined1  [8])plVar11[1];
          iVar9 = std::
                  _Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(this_00,(key_type *)local_58);
          if (iVar9.
              super__Node_iterator_base<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_false>
              ._M_cur != (__node_type *)0x0) {
            if (*(long **)((long)local_b8 +
                          ((ulong)local_58 % (ulong)gen_mod_map._M_h._M_buckets) * 8) == (long *)0x0
               ) {
LAB_001f10d5:
              std::__throw_out_of_range("_Map_base::at");
            }
            plVar14 = (long *)**(long **)((long)local_b8 +
                                         ((ulong)local_58 % (ulong)gen_mod_map._M_h._M_buckets) * 8)
            ;
            pGVar12 = (Generator *)plVar14[1];
            while (local_58 != (undefined1  [8])pGVar12) {
              plVar14 = (long *)*plVar14;
              if ((plVar14 == (long *)0x0) ||
                 (pGVar12 = (Generator *)plVar14[1],
                 (ulong)pGVar12 % (ulong)gen_mod_map._M_h._M_buckets !=
                 (ulong)local_58 % (ulong)gen_mod_map._M_h._M_buckets)) goto LAB_001f10d5;
            }
            pMVar2 = (Module *)plVar14[2];
            iVar9 = std::
                    _Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(this_00,(key_type *)local_58);
            if (iVar9.
                super__Node_iterator_base<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_false>
                ._M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
            }
            p_Var10 = *(_Rb_tree_node_base **)
                       ((long)iVar9.
                              super__Node_iterator_base<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_false>
                              ._M_cur + 0x28);
            if (p_Var10 !=
                (_Rb_tree_node_base *)
                ((long)iVar9.
                       super__Node_iterator_base<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_false>
                       ._M_cur + 0x18)) {
              gen_mod_map._M_h._M_single_bucket =
                   (__node_base_ptr)
                   ((long)iVar9.
                          super__Node_iterator_base<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_false>
                          ._M_cur + 0x18);
              do {
                Generator::get_var((Generator *)local_110,(string *)local_58);
                if (local_110 == (undefined1  [8])0x0) {
                  add_generator_static_value(pMVar2,(string *)(p_Var10 + 1),(string *)(p_Var10 + 2))
                  ;
                }
                else if ((*(VarType *)((long)local_110 + 0x168) & ~PortIO) == Base) {
                  create_variables((vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&breakpoint_conditions._M_h._M_single_bucket,(Var *)local_110,
                                   (string *)(p_Var10 + 1));
                  p_Var6 = (__node_base_ptr)CONCAT44(uStack_3e4,_stream);
                  for (p_Var16 = breakpoint_conditions._M_h._M_single_bucket; p_Var16 != p_Var6;
                      p_Var16 = p_Var16 + 0xf) {
                    table._128_8_ = local_158;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&table.reorder_,p_Var16->_M_nxt,
                               (long)&p_Var16->_M_nxt->_M_nxt + (long)&(p_Var16[1]._M_nxt)->_M_nxt);
                    local_148[0] = &local_138;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_148,p_Var16[4]._M_nxt,
                               (long)&(p_Var16[4]._M_nxt)->_M_nxt +
                               (long)&(p_Var16[5]._M_nxt)->_M_nxt);
                    local_118 = p_Var16[10]._M_nxt;
                    local_128 = p_Var16[8]._M_nxt;
                    p_Stack_120 = p_Var16[9]._M_nxt;
                    std::
                    vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
                    ::emplace_back<hgdb::json::Variable>
                              (&pMVar2->variables_,(Variable *)&table.reorder_);
                    if (local_148[0] != &local_138) {
                      operator_delete(local_148[0],local_138._M_allocated_capacity + 1);
                    }
                    if ((long *)table._128_8_ != local_158) {
                      operator_delete((void *)table._128_8_,local_158[0] + 1);
                    }
                  }
                  std::
                  vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~vector((vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&breakpoint_conditions._M_h._M_single_bucket);
                }
                if (visited_gens._M_h._M_buckets != (__buckets_ptr)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             visited_gens._M_h._M_buckets);
                }
                p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
              } while (p_Var10 != (_Rb_tree_node_base *)gen_mod_map._M_h._M_single_bucket);
            }
          }
          plVar11 = (long *)*plVar11;
        } while (plVar11 != (long *)0x0);
      }
    }
  }
  local_110 = (undefined1  [8])&visited_gens._M_h._M_rehash_policy._M_next_resize;
  visited_gens._M_h._M_buckets = (__buckets_ptr)0x1;
  visited_gens._M_h._M_bucket_count = 0;
  visited_gens._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited_gens._M_h._M_element_count._0_4_ = 0x3f800000;
  visited_gens._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visited_gens._M_h._M_rehash_policy._4_4_ = 0;
  visited_gens._M_h._M_rehash_policy._M_next_resize = 0;
  puVar17 = *(undefined8 **)local_38;
  puVar5 = *(undefined8 **)(local_38 + 8);
  if (puVar17 != puVar5) {
    local_38 = local_38 + 0x18;
    do {
      local_58 = (undefined1  [8])Stmt::generator_parent((Stmt *)*puVar17);
      if (local_58 != (undefined1  [8])0x0) {
        if (*(long **)((long)local_110 + ((ulong)local_58 % (ulong)visited_gens._M_h._M_buckets) * 8
                      ) != (long *)0x0) {
          plVar11 = (long *)**(long **)((long)local_110 +
                                       ((ulong)local_58 % (ulong)visited_gens._M_h._M_buckets) * 8);
          pGVar12 = (Generator *)plVar11[1];
          do {
            if (local_58 == (undefined1  [8])pGVar12) goto LAB_001f0f3e;
            plVar11 = (long *)*plVar11;
          } while ((plVar11 != (long *)0x0) &&
                  (pGVar12 = (Generator *)plVar11[1],
                  (ulong)pGVar12 % (ulong)visited_gens._M_h._M_buckets ==
                  (ulong)local_58 % (ulong)visited_gens._M_h._M_buckets));
        }
        if (*(long **)((long)local_b8 + ((ulong)local_58 % (ulong)gen_mod_map._M_h._M_buckets) * 8)
            != (long *)0x0) {
          plVar11 = (long *)**(long **)((long)local_b8 +
                                       ((ulong)local_58 % (ulong)gen_mod_map._M_h._M_buckets) * 8);
          pGVar12 = (Generator *)plVar11[1];
          while (local_58 != (undefined1  [8])pGVar12) {
            plVar11 = (long *)*plVar11;
            if ((plVar11 == (long *)0x0) ||
               (pGVar12 = (Generator *)plVar11[1],
               (ulong)pGVar12 % (ulong)gen_mod_map._M_h._M_buckets !=
               (ulong)local_58 % (ulong)gen_mod_map._M_h._M_buckets)) goto LAB_001f0f3e;
          }
          std::
          _Hashtable<kratos::Generator*,kratos::Generator*,std::allocator<kratos::Generator*>,std::__detail::_Identity,std::equal_to<kratos::Generator*>,std::hash<kratos::Generator*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<kratos::Generator*&>
                    ((_Hashtable<kratos::Generator*,kratos::Generator*,std::allocator<kratos::Generator*>,std::__detail::_Identity,std::equal_to<kratos::Generator*>,std::hash<kratos::Generator*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_110,local_58);
          if (*(long **)((long)local_b8 + ((ulong)local_58 % (ulong)gen_mod_map._M_h._M_buckets) * 8
                        ) == (long *)0x0) goto LAB_001f10e1;
          plVar11 = (long *)**(long **)((long)local_b8 +
                                       ((ulong)local_58 % (ulong)gen_mod_map._M_h._M_buckets) * 8);
          pGVar12 = (Generator *)plVar11[1];
          while (local_58 != (undefined1  [8])pGVar12) {
            plVar11 = (long *)*plVar11;
            if ((plVar11 == (long *)0x0) ||
               (pGVar12 = (Generator *)plVar11[1],
               (ulong)pGVar12 % (ulong)gen_mod_map._M_h._M_buckets !=
               (ulong)local_58 % (ulong)gen_mod_map._M_h._M_buckets)) {
LAB_001f10e1:
              std::__throw_out_of_range("_Map_base::at");
            }
          }
          local_3a8 = plVar11[2];
          _stream = 0;
          local_3e0._M_buckets = &local_3e0._M_single_bucket;
          local_3e0._M_bucket_count = 1;
          local_3e0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_3e0._M_element_count = 0;
          local_3e0._M_rehash_policy._M_max_load_factor = 1.0;
          local_3e0._M_rehash_policy._M_next_resize = 0;
          local_3e0._M_single_bucket = (__node_base_ptr)0x0;
          breakpoint_conditions._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_002b2ea8;
          local_3a0 = (Generator *)local_58;
          local_398._M_buckets = &local_398._M_single_bucket;
          local_398._M_bucket_count = 1;
          local_398._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_398._M_element_count = 0;
          local_398._M_rehash_policy._M_max_load_factor = 1.0;
          local_398._M_rehash_policy._M_next_resize = 0;
          local_398._M_single_bucket = (__node_base_ptr)0x0;
          local_360 = (DebugDatabase *)local_38;
          local_358 = local_428;
          IRVisitor::visit_content
                    ((IRVisitor *)&breakpoint_conditions._M_h._M_single_bucket,(Generator *)local_58
                    );
          breakpoint_conditions._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_002b2ea8;
          std::
          _Hashtable<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&local_398);
          breakpoint_conditions._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_002b0dc0;
          std::
          _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&local_3e0);
        }
      }
LAB_001f0f3e:
      puVar17 = puVar17 + 1;
    } while (puVar17 != puVar5);
  }
  hgdb::json::SymbolTable::compress_var((SymbolTable *)local_1f0);
  puVar7 = table.modules_.
           super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  breakpoint_conditions._M_h._M_single_bucket = (__node_base_ptr)&PTR_handle_002b3328;
  if ((pointer)table.top_names_._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      table.modules_.
      super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    puVar18 = (pointer)table.top_names_._M_t._M_impl.super__Rb_tree_header._M_node_count;
    do {
      hgdb::json::SymbolTable::ScopeVisitor::visit
                ((ScopeVisitor *)&breakpoint_conditions._M_h._M_single_bucket,
                 (ScopeBase *)
                 (puVar18->_M_t).
                 super___uniq_ptr_impl<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_hgdb::json::Module_*,_std::default_delete<hgdb::json::Module>_>
                 .super__Head_base<0UL,_hgdb::json::Module_*,_false>._M_head_impl);
      puVar18 = puVar18 + 1;
    } while (puVar18 != puVar7);
  }
  table.variables_.super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  std::ofstream::ofstream(&breakpoint_conditions._M_h._M_single_bucket);
  std::ofstream::open((string *)&breakpoint_conditions._M_h._M_single_bucket,(_Ios_Openmode)filename
                     );
  hgdb::json::SymbolTable::output_abi_cxx11_((string *)local_58,(SymbolTable *)local_1f0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&breakpoint_conditions._M_h._M_single_bucket,(char *)local_58,(long)gen_1);
  if (local_58 != (undefined1  [8])&stack0xffffffffffffffb8) {
    operator_delete((void *)local_58,local_48 + 1);
  }
  std::ofstream::close();
  breakpoint_conditions._M_h._M_single_bucket = _VTT;
  *(undefined8 *)((long)&breakpoint_conditions._M_h._M_single_bucket + (long)_VTT[-3]._M_nxt) =
       _pthread_mutex_unlock;
  std::filebuf::~filebuf((filebuf *)&stream);
  std::ios_base::~ios_base(local_2f8);
  std::
  _Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_110);
  std::
  _Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_b8);
  std::vector<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>::~vector
            ((vector<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_> *)
             &table.modules_.
              super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
  ::~vector((vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
             *)&table.top_names_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&table.framework_name_.field_2 + 8));
  if (local_1f0 != (undefined1  [8])&table.framework_name_._M_string_length) {
    operator_delete((void *)local_1f0,table.framework_name_._M_string_length + 1);
  }
  std::
  _Hashtable<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_428);
  return;
}

Assistant:

void DebugDatabase::save_database(const std::string &filename, bool override) {
    if (override) {
        if (fs::exists(filename)) {
            fs::remove(filename);
        }
    }

    // compute breakpoint conditions
    auto breakpoint_conditions = compute_enable_condition(top_);
    auto table = hgdb::json::SymbolTable("kratos");

    std::unordered_map<Generator *, hgdb::json::Module *> gen_mod_map;

    // first pass to create modules
    for (auto *gen : generators_) {
        auto *mod = table.add_module(gen->name);
        gen_mod_map.emplace(gen, mod);
    }
    // second pass to add instances
    for (auto *gen : generators_) {
        auto *mod = gen_mod_map.at(gen);
        auto children = gen->get_child_generators();
        for (auto const &child : children) {
            if (gen_mod_map.find(child.get()) == gen_mod_map.end()) continue;
            auto *child_mod = gen_mod_map.at(child.get());
            mod->add_instance(child->instance_name, child_mod);
        }
    }

    // now add generator variables
    for (auto *gen : generators_) {
        if (variable_mapping_.find(gen) == variable_mapping_.end()) continue;
        auto *mod = gen_mod_map.at(gen);
        auto const &var_names = variable_mapping_.at(gen);
        for (auto const &[front_name, back_name] : var_names) {
            auto var = gen->get_var(back_name);
            if (var && (var->type() == VarType::Base || var->type() == VarType::PortIO)) {
                auto vars = create_variables(var.get(), front_name);
                for (auto const &v : vars) {
                    mod->add_variable(v.first);
                }
            } else if (!var) {
                add_generator_static_value(*mod, front_name, back_name);
            }
        }
    }

    // now deal with scopes
    std::unordered_set<Generator *> visited_gens;
    for (auto const *stmt : break_points_) {
        auto *gen = stmt->generator_parent();
        if (!gen || visited_gens.find(gen) != visited_gens.end()) continue;
        if (gen_mod_map.find(gen) == gen_mod_map.end()) continue;
        visited_gens.emplace(gen);
        auto *mod = gen_mod_map.at(gen);
        StmtScopeVisitor v(*mod, gen, stmt_mapping_, breakpoint_conditions);
        v.visit_content(gen);
    }

    // compress the table
    table.compress();

    // setting attributes
    table.disable_reorder();

    std::ofstream stream;
    stream.open(filename);
    stream << table.output();
    stream.close();
}